

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CharSet.cpp
# Opt level: O2

bool __thiscall
UnifiedRegex::CharSetInner::IsSubsetOf(CharSetInner *this,uint level,CharSetNode *other)

{
  CharSetNode *pCVar1;
  code *pcVar2;
  bool bVar3;
  int iVar4;
  undefined4 *puVar5;
  uint i;
  long lVar6;
  
  if (level == 0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar5 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/CharSet.cpp"
                       ,0x256,"(level > 0)","level > 0");
    if (!bVar3) goto LAB_00cd80d3;
    *puVar5 = 0;
  }
  if ((other == (CharSetNode *)0x0) ||
     (iVar4 = (*other->_vptr_CharSetNode[0xd])(other), (char)iVar4 != '\0')) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar5 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/CharSet.cpp"
                       ,599,"(other != nullptr && !other->IsLeaf())",
                       "other != nullptr && !other->IsLeaf()");
    if (!bVar3) {
LAB_00cd80d3:
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    *puVar5 = 0;
  }
  if (other == (CharSetNode *)&CharSetFull::Instance) {
    bVar3 = true;
  }
  else {
    for (lVar6 = 0; bVar3 = lVar6 == 0x10, !bVar3; lVar6 = lVar6 + 1) {
      pCVar1 = this->children[lVar6];
      if (pCVar1 != (CharSetNode *)0x0) {
        if (other[lVar6 + 1]._vptr_CharSetNode == (_func_int **)0x0) {
          return bVar3;
        }
        iVar4 = (*pCVar1->_vptr_CharSetNode[9])(pCVar1,(ulong)(level - 1));
        if ((char)iVar4 != '\0') {
          return bVar3;
        }
      }
    }
  }
  return bVar3;
}

Assistant:

bool CharSetInner::IsSubsetOf(uint level, const CharSetNode* other) const
    {
        Assert(level > 0);
        Assert(other != nullptr && !other->IsLeaf());
        if (other == CharSetFull::TheFullNode)
            return true;
        level--;
        const CharSetInner* otherInner = (CharSetInner*)other;
        for (uint i = 0; i < branchingPerInnerLevel; i++)
        {
            if (children[i] != nullptr)
            {
                if (otherInner->children[i] == nullptr)
                    return false;
                if (children[i]->IsSubsetOf(level, otherInner->children[i]))
                    return false;
            }
        }
        return true;
    }